

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_server.cc
# Opt level: O0

void __thiscall
iqxmlrpc::anon_unknown_0::Https_server_connection::send_succeed
          (Https_server_connection *this,bool *terminate)

{
  bool bVar1;
  string local_38 [32];
  bool *local_18;
  bool *terminate_local;
  Https_server_connection *this_local;
  
  local_18 = terminate;
  terminate_local = (bool *)this;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::operator=((string *)&(this->super_Server_connection).response,local_38);
  std::__cxx11::string::~string(local_38);
  if (((this->super_Server_connection).keep_alive & 1U) == 0) {
    bVar1 = iqnet::ssl::Reaction_connection::reg_shutdown(&this->super_Reaction_connection);
    *local_18 = bVar1;
  }
  else {
    my_reg_recv(this);
  }
  return;
}

Assistant:

void Https_server_connection::send_succeed( bool& terminate )
{
  response = std::string();

  if( keep_alive )
    my_reg_recv();
  else
    terminate = reg_shutdown();
}